

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_test.cc
# Opt level: O3

void __thiscall
sample_after_nomalizing_degenerate::test_method(sample_after_nomalizing_degenerate *this)

{
  int iVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  int scode;
  vector<float,_std::allocator<float>_> pdf;
  undefined4 local_100;
  uint32_t chosen_index;
  undefined **local_f8;
  ulong uStack_f0;
  undefined8 *local_e8;
  int **local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined8 *local_c8;
  undefined4 **local_c0;
  vector<float,_std::allocator<float>_> expected;
  undefined4 *local_a0;
  int *local_98;
  undefined1 local_90;
  undefined8 local_88;
  shared_count sStack_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  char *local_30;
  
  local_e8 = (undefined8 *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8 = (undefined **)0x0;
  uStack_f0 = 0;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_f8;
  std::vector<float,_std::allocator<float>_>::vector(&pdf,__l,(allocator_type *)&local_d8);
  local_f8 = (undefined **)0x3f800000;
  uStack_f0 = 0;
  local_e8 = (undefined8 *)((ulong)local_e8 & 0xffffffff00000000);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_f8;
  std::vector<float,_std::allocator<float>_>::vector(&expected,__l_00,(allocator_type *)&local_d8);
  iVar1 = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  scode = iVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x2d);
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_00308850;
  local_38 = &boost::unit_test::lazy_ostream::inst;
  local_30 = "";
  local_a0 = &local_100;
  local_90 = iVar1 == 0;
  local_100 = 0;
  local_88 = 0;
  sStack_80.pi_ = (sp_counted_base *)0x0;
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_50 = "";
  local_98 = &scode;
  local_e0 = &local_98;
  uStack_f0 = uStack_f0 & 0xffffffffffffff00;
  local_f8 = &PTR__lazy_ostream_00308960;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_a0;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_00308960;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_80);
  check_float_vectors(&pdf,&expected,0.0001);
  if (expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sample_after_nomalizing_degenerate) {
  std::vector<float> pdf = { 0.0f, 0.0f, 0.0f, 0.0f, 0.0f };
  const std::vector<float> expected = { 1.0f, 0.0f, 0.0f, 0.0f, 0.0f };
  uint32_t chosen_index;

  const auto scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);
}